

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make_set.hpp
# Opt level: O2

set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> * __thiscall
burst::make_set<unsigned_int,std::vector<unsigned_int,std::allocator<unsigned_int>>>
          (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
           *__return_storage_ptr__,burst *this,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *values)

{
  std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>::
  set<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
            ((set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>> *)
             __return_storage_ptr__,
             (__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              )*(uint **)this,
             (__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              )*(uint **)(this + 8));
  return __return_storage_ptr__;
}

Assistant:

auto make_set (InputRange && values)
    {
        using std::begin;
        using std::end;
        return
            std::set<Value>
            (
                begin(std::forward<InputRange>(values)),
                end(std::forward<InputRange>(values))
            );
    }